

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O1

void __thiscall duckdb::Connection::Commit(Connection *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ClientContext *query;
  pointer pMVar2;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  result;
  unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> result_1;
  _Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false> local_40;
  string local_38;
  element_type *local_18;
  
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"COMMIT","");
  query = shared_ptr<duckdb::ClientContext,_true>::operator->(&this->context);
  ClientContext::Query((ClientContext *)&stack0xffffffffffffffe8,(string *)query,SUB81(&local_38,0))
  ;
  local_40._M_head_impl = (MaterializedQueryResult *)local_18;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  pMVar2 = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
           ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                         *)&local_40);
  if ((pMVar2->super_QueryResult).super_BaseQueryResult.success != false) {
    if ((element_type *)local_40._M_head_impl != (element_type *)0x0) {
      (*(code *)((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&(((((original *)
                           &((local_40._M_head_impl)->super_QueryResult).super_BaseQueryResult.
                            _vptr_BaseQueryResult)->
                          super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_
                + 8))->_M_pi)();
    }
    return;
  }
  pMVar2 = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
           ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                         *)&local_40);
  local_38._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,anon_var_dwarf_4f001a4 + 9);
  BaseQueryResult::ThrowError((BaseQueryResult *)pMVar2,&local_38);
}

Assistant:

void Connection::Commit() {
	auto result = Query("COMMIT");
	if (result->HasError()) {
		result->ThrowError();
	}
}